

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pDepthTests.cpp
# Opt level: O3

IterateResult __thiscall deqp::gles3::Performance::anon_unknown_0::BaseCase::iterate(BaseCase *this)

{
  TextureFormat *pTVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pbVar3;
  ChannelType CVar4;
  TestLog *log;
  RenderContext *context;
  TextureFormat TVar5;
  TextureFormat *pTVar6;
  RenderData *shaderProgram;
  int iVar7;
  deUint32 dVar8;
  uint uVar9;
  int iVar10;
  undefined4 extraout_var;
  ObjectTraits *pOVar11;
  RenderData *pRVar12;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar13;
  TextureFormat *pTVar14;
  SampleBuilder *pSVar15;
  TestError *this_00;
  LogValueInfo *access;
  void *__buf;
  TextureFormat *pTVar16;
  int step;
  long lVar17;
  ChannelType *pCVar18;
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  ulong uVar22;
  int iVar23;
  ulong uVar24;
  bool bVar25;
  vector<int,_std::allocator<int>_> params;
  vector<deqp::gles3::Performance::(anonymous_namespace)::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::Sample>_>
  results;
  size_type __dnew_3;
  size_type __dnew;
  RenderDataP occludedData;
  int workload;
  RenderDataP occluderData;
  size_type __dnew_2;
  Renderbuffer depthbuffer;
  Renderbuffer renderbuffer;
  size_type __dnew_1;
  Framebuffer framebuffer;
  TextureLevel resultTex;
  Random rng;
  vector<int,_std::allocator<int>_> local_648;
  TextureFormat *local_628;
  TextureFormat *pTStack_620;
  TextureFormat *local_618;
  LogValueInfo local_610;
  string local_5a8;
  string local_588;
  string local_568;
  string local_548;
  string local_528;
  string local_508;
  string local_4e8;
  LogValueInfo local_4c8;
  UniqueBase<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
  local_460;
  undefined1 local_450 [8];
  undefined1 auStack_448 [16];
  ChannelOrder CStack_438;
  ChannelType CStack_434;
  undefined1 local_430 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_410;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_400;
  qpSampleValueTag local_3f0;
  ios_base local_3d8 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_3c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3a0;
  pointer local_380;
  pointer local_370;
  UniqueBase<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
  local_2d0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  LogValueInfo local_220;
  string local_1b8;
  string local_198;
  string local_178;
  ObjectWrapper local_158;
  ObjectWrapper local_140;
  LogValueInfo local_128;
  string local_c0;
  string local_a0;
  ObjectWrapper local_80;
  TextureLevel local_68;
  deRandom local_40;
  Functions *gl;
  
  iVar7 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar7);
  log = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  pOVar11 = glu::objectTraits(OBJECTTYPE_FRAMEBUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_80,gl,pOVar11);
  pOVar11 = glu::objectTraits(OBJECTTYPE_RENDERBUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_140,gl,pOVar11);
  pOVar11 = glu::objectTraits(OBJECTTYPE_RENDERBUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_158,gl,pOVar11);
  local_628 = (TextureFormat *)0x0;
  pTStack_620 = (TextureFormat *)0x0;
  local_618 = (TextureFormat *)0x0;
  local_648.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_648.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_648.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  local_2d0.m_data.ptr = (RenderData *)0x0;
  local_460.m_data.ptr = (RenderData *)0x0;
  local_450._0_4_ = RGBA;
  local_450._4_4_ = UNORM_INT8;
  tcu::TextureLevel::TextureLevel(&local_68,(TextureFormat *)local_450,0x200,0x200,1);
  dVar8 = deStringHash((this->super_TestCase).super_TestNode.m_name._M_dataplus._M_p);
  uVar9 = tcu::CommandLine::getBaseSeed
                    (((this->super_TestCase).super_TestNode.m_testCtx)->m_cmdLine);
  uVar21 = (dVar8 >> 0x10 ^ dVar8 ^ 0x3d) * 9;
  uVar21 = (uVar21 >> 4 ^ uVar21) * 0x27d4eb2d;
  deRandom_init(&local_40,uVar21 >> 0xf ^ uVar9 ^ uVar21);
  (*(this->super_TestCase).super_TestNode._vptr_TestNode[6])();
  (*gl->bindRenderbuffer)(0x8d41,local_140.m_object);
  (*gl->renderbufferStorage)(0x8d41,0x8058,0x200,0x200);
  (*gl->bindRenderbuffer)(0x8d41,local_158.m_object);
  (*gl->renderbufferStorage)(0x8d41,0x88f0,0x200,0x200);
  (*gl->bindFramebuffer)(0x8d40,local_80.m_object);
  (*gl->framebufferRenderbuffer)(0x8d40,0x8ce0,0x8d41,local_140.m_object);
  (*gl->framebufferRenderbuffer)(0x8d40,0x8d00,0x8d41,local_158.m_object);
  (*gl->viewport)(0,0,0x200,0x200);
  (*gl->clearColor)(0.125,0.25,0.5,1.0);
  iVar7 = (*(this->super_TestCase).super_TestNode._vptr_TestNode[9])();
  pRVar12 = (RenderData *)operator_new(0x108);
  (*(this->super_TestCase).super_TestNode._vptr_TestNode[7])(local_450,this);
  RenderData::RenderData(pRVar12,(ObjectData *)local_450,this->m_renderCtx,log);
  local_220.m_name._M_dataplus._M_p = (pointer)0x0;
  de::details::
  UniqueBase<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
  ::reset(&local_2d0);
  local_2d0.m_data.ptr = pRVar12;
  de::details::
  UniqueBase<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
  ::reset((UniqueBase<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
           *)&local_220);
  if (local_380 != (pointer)0x0) {
    operator_delete(local_380,(long)local_370 - (long)local_380);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_3a0);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_3c0);
  lVar17 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_450 + lVar17));
    lVar17 = lVar17 + -0x18;
  } while (lVar17 != -0x18);
  pRVar12 = (RenderData *)operator_new(0x108);
  (*(this->super_TestCase).super_TestNode._vptr_TestNode[8])(local_450,this);
  RenderData::RenderData(pRVar12,(ObjectData *)local_450,this->m_renderCtx,log);
  local_220.m_name._M_dataplus._M_p = (pointer)0x0;
  if (local_460.m_data.ptr != pRVar12) {
    de::details::
    UniqueBase<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
    ::reset(&local_460);
    local_460.m_data.ptr = pRVar12;
  }
  de::details::
  UniqueBase<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
  ::reset((UniqueBase<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
           *)&local_220);
  if (local_380 != (pointer)0x0) {
    operator_delete(local_380,(long)local_370 - (long)local_380);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_3a0);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_3c0);
  lVar17 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_450 + lVar17));
    shaderProgram = local_2d0.m_data.ptr;
    pRVar12 = local_460.m_data.ptr;
    lVar17 = lVar17 + -0x18;
  } while (lVar17 != -0x18);
  if (((local_2d0.m_data.ptr)->m_program).m_program.m_info.linkOk == false) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,"occluderData->m_program.isOk()",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/performance/es3pDepthTests.cpp"
               ,0x243);
  }
  else {
    if (((local_460.m_data.ptr)->m_program).m_program.m_info.linkOk != false) {
      (*gl->clear)(0x4500);
      (*gl->enable)(0xb71);
      iVar10 = (*this->m_renderCtx->_vptr_RenderContext[3])();
      lVar17 = CONCAT44(extraout_var_00,iVar10);
      (**(code **)(lVar17 + 0x1680))((shaderProgram->m_program).m_program.m_program);
      (**(code **)(lVar17 + 0xd8))((shaderProgram->m_vao).super_ObjectWrapper.m_object);
      (**(code **)(lVar17 + 0x538))(4,0,shaderProgram->m_numVertices);
      (**(code **)(lVar17 + 0xd8))(0);
      iVar10 = (*this->m_renderCtx->_vptr_RenderContext[3])();
      lVar17 = CONCAT44(extraout_var_01,iVar10);
      (**(code **)(lVar17 + 0x1680))((pRVar12->m_program).m_program.m_program);
      (**(code **)(lVar17 + 0xd8))((pRVar12->m_vao).super_ObjectWrapper.m_object);
      (**(code **)(lVar17 + 0x538))(4,0,pRVar12->m_numVertices);
      (**(code **)(lVar17 + 0xd8))(0);
      context = this->m_renderCtx;
      tcu::TextureLevel::getAccess((PixelBufferAccess *)local_450,&local_68);
      glu::readPixels(context,0,0,(PixelBufferAccess *)local_450);
      tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_220,&local_68);
      TVar5 = (TextureFormat)((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
      local_610.m_name._M_dataplus._M_p = (pointer)&local_610.m_name.field_2;
      local_610.m_name.field_2._M_allocated_capacity._0_5_ = 0x656d6f6547;
      local_610.m_name._M_string_length = 8;
      local_610.m_name.field_2._5_4_ = 0x797274;
      paVar2 = &local_4c8.m_name.field_2;
      local_4c8.m_name.field_2._M_allocated_capacity._0_5_ = 0x656d6f6547;
      local_4c8.m_name._M_string_length = 8;
      local_4c8.m_name.field_2._5_4_ = 0x797274;
      local_4c8.m_name._M_dataplus._M_p = (pointer)paVar2;
      tcu::LogSection::LogSection((LogSection *)local_450,&local_610.m_name,&local_4c8.m_name);
      tcu::TestLog::startSection((TestLog *)TVar5,(char *)local_450,(char *)local_430._0_8_);
      pbVar3 = (pointer)(local_430 + 0x10);
      if ((pointer)local_430._0_8_ != pbVar3) {
        operator_delete((void *)local_430._0_8_,(ulong)(local_430._16_8_ + 1));
      }
      if (local_450 != (undefined1  [8])((long)auStack_448 + 8)) {
        operator_delete((void *)local_450,auStack_448._8_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4c8.m_name._M_dataplus._M_p != paVar2) {
        operator_delete(local_4c8.m_name._M_dataplus._M_p,
                        CONCAT35(local_4c8.m_name.field_2._M_allocated_capacity._5_3_,
                                 local_4c8.m_name.field_2._M_allocated_capacity._0_5_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_610.m_name._M_dataplus._M_p != &local_610.m_name.field_2) {
        operator_delete(local_610.m_name._M_dataplus._M_p,
                        CONCAT35(local_610.m_name.field_2._M_allocated_capacity._5_3_,
                                 local_610.m_name.field_2._M_allocated_capacity._0_5_) + 1);
      }
      local_450 = (undefined1  [8])TVar5;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_448);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)auStack_448,
                 "Occluding geometry is green with shade dependent on depth (rgb == 0, depth, 0)",
                 0x4e);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_450,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_448);
      std::ios_base::~ios_base(local_3d8);
      local_450 = (undefined1  [8])TVar5;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_448);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)auStack_448,
                 "Occluded geometry is red with shade dependent on depth (rgb == depth, 0, 0)",0x4b)
      ;
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_450,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_448);
      std::ios_base::~ios_base(local_3d8);
      local_450 = (undefined1  [8])TVar5;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_448);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)auStack_448,"Primitive edges are a lighter shade of red/green",0x30);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_450,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_448);
      std::ios_base::~ios_base(local_3d8);
      local_610.m_name._M_dataplus._M_p = (pointer)&local_610.m_name.field_2;
      local_610.m_name.field_2._M_allocated_capacity._0_5_ = 0x2074736554;
      local_610.m_name.field_2._5_4_ = 0x6d6f6547;
      local_610.m_name.field_2._9_4_ = 0x79727465;
      local_610.m_name._M_string_length = 0xd;
      local_610.m_name.field_2._M_local_buf[0xd] = '\0';
      local_4c8.m_name.field_2._M_allocated_capacity._0_5_ = 0x2074736554;
      local_4c8.m_name.field_2._5_4_ = 0x6d6f6547;
      local_4c8.m_name.field_2._9_4_ = 0x79727465;
      local_4c8.m_name._M_string_length = 0xd;
      local_4c8.m_name.field_2._M_local_buf[0xd] = '\0';
      access = &local_220;
      local_4c8.m_name._M_dataplus._M_p = (pointer)paVar2;
      tcu::LogImage::LogImage
                ((LogImage *)local_450,&local_610.m_name,&local_4c8.m_name,
                 (ConstPixelBufferAccess *)access,QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)local_450,TVar5.order,__buf,(size_t)access);
      if ((pointer)local_430._0_8_ != pbVar3) {
        operator_delete((void *)local_430._0_8_,(ulong)(local_430._16_8_ + 1));
      }
      if (local_450 != (undefined1  [8])((long)auStack_448 + 8)) {
        operator_delete((void *)local_450,auStack_448._8_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4c8.m_name._M_dataplus._M_p != paVar2) {
        operator_delete(local_4c8.m_name._M_dataplus._M_p,
                        CONCAT35(local_4c8.m_name.field_2._M_allocated_capacity._5_3_,
                                 local_4c8.m_name.field_2._M_allocated_capacity._0_5_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_610.m_name._M_dataplus._M_p != &local_610.m_name.field_2) {
        operator_delete(local_610.m_name._M_dataplus._M_p,
                        CONCAT35(local_610.m_name.field_2._M_allocated_capacity._5_3_,
                                 local_610.m_name.field_2._M_allocated_capacity._0_5_) + 1);
      }
      tcu::TestLog::endSection((TestLog *)TVar5);
      local_610.m_name._M_dataplus._M_p = (pointer)&local_610.m_name.field_2;
      local_610.m_name.field_2._M_allocated_capacity._0_5_ = 0x756c63634f;
      local_610.m_name._M_string_length = 8;
      local_610.m_name.field_2._5_4_ = 0x726564;
      local_4c8.m_name.field_2._M_allocated_capacity._0_5_ = 0x756c63634f;
      local_4c8.m_name._M_string_length = 8;
      local_4c8.m_name.field_2._5_4_ = 0x726564;
      local_4c8.m_name._M_dataplus._M_p = (pointer)paVar2;
      tcu::LogSection::LogSection((LogSection *)local_450,&local_610.m_name,&local_4c8.m_name);
      tcu::TestLog::startSection((TestLog *)TVar5,(char *)local_450,(char *)local_430._0_8_);
      if ((pointer)local_430._0_8_ != pbVar3) {
        operator_delete((void *)local_430._0_8_,(ulong)(local_430._16_8_ + 1));
      }
      if (local_450 != (undefined1  [8])((long)auStack_448 + 8)) {
        operator_delete((void *)local_450,auStack_448._8_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4c8.m_name._M_dataplus._M_p != paVar2) {
        operator_delete(local_4c8.m_name._M_dataplus._M_p,
                        CONCAT35(local_4c8.m_name.field_2._M_allocated_capacity._5_3_,
                                 local_4c8.m_name.field_2._M_allocated_capacity._0_5_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_610.m_name._M_dataplus._M_p != &local_610.m_name.field_2) {
        operator_delete(local_610.m_name._M_dataplus._M_p,
                        CONCAT35(local_610.m_name.field_2._M_allocated_capacity._5_3_,
                                 local_610.m_name.field_2._M_allocated_capacity._0_5_) + 1);
      }
      glu::operator<<((TestLog *)TVar5,&shaderProgram->m_program);
      tcu::TestLog::endSection((TestLog *)TVar5);
      local_610.m_name._M_dataplus._M_p = (pointer)&local_610.m_name.field_2;
      local_610.m_name.field_2._M_allocated_capacity._0_5_ = 0x756c63634f;
      local_610.m_name._M_string_length = 8;
      local_610.m_name.field_2._5_4_ = 0x646564;
      local_4c8.m_name.field_2._M_allocated_capacity._0_5_ = 0x756c63634f;
      local_4c8.m_name._M_string_length = 8;
      local_4c8.m_name.field_2._5_4_ = 0x646564;
      local_4c8.m_name._M_dataplus._M_p = (pointer)paVar2;
      tcu::LogSection::LogSection((LogSection *)local_450,&local_610.m_name,&local_4c8.m_name);
      tcu::TestLog::startSection((TestLog *)TVar5,(char *)local_450,(char *)local_430._0_8_);
      if ((pointer)local_430._0_8_ != pbVar3) {
        operator_delete((void *)local_430._0_8_,(ulong)(local_430._16_8_ + 1));
      }
      if (local_450 != (undefined1  [8])((long)auStack_448 + 8)) {
        operator_delete((void *)local_450,auStack_448._8_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4c8.m_name._M_dataplus._M_p != paVar2) {
        operator_delete(local_4c8.m_name._M_dataplus._M_p,
                        CONCAT35(local_4c8.m_name.field_2._M_allocated_capacity._5_3_,
                                 local_4c8.m_name.field_2._M_allocated_capacity._0_5_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_610.m_name._M_dataplus._M_p != &local_610.m_name.field_2) {
        operator_delete(local_610.m_name._M_dataplus._M_p,
                        CONCAT35(local_610.m_name.field_2._M_allocated_capacity._5_3_,
                                 local_610.m_name.field_2._M_allocated_capacity._0_5_) + 1);
      }
      glu::operator<<((TestLog *)TVar5,&pRVar12->m_program);
      tcu::TestLog::endSection((TestLog *)TVar5);
      std::vector<int,_std::allocator<int>_>::reserve(&local_648,0xa0);
      iVar10 = 0;
      do {
        local_450._0_4_ = (iVar10 * iVar7) / 10;
        iVar23 = 0x10;
        do {
          if (local_648.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_648.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_648,
                       (iterator)
                       local_648.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,(int *)local_450);
          }
          else {
            *local_648.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish = local_450._0_4_;
            local_648.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = local_648.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
          }
          iVar23 = iVar23 + -1;
        } while (iVar23 != 0);
        iVar10 = iVar10 + 1;
      } while (iVar10 != 10);
      de::Random::shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                ((Random *)&local_40,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 local_648.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 local_648.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      if (local_648.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish !=
          local_648.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start) {
        uVar24 = 0;
        do {
          CVar4 = local_648.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar24];
          (*(this->super_TestCase).super_TestNode._vptr_TestNode[10])
                    (local_450,this,shaderProgram,pRVar12);
          pTVar6 = local_628;
          CStack_434 = CVar4;
          CStack_438 = (ChannelOrder)uVar24;
          if (pTStack_620 == local_618) {
            uVar20 = (long)pTStack_620 - (long)local_628;
            if (uVar20 == 0x7fffffffffffffe0) {
              std::__throw_length_error("vector::_M_realloc_insert");
            }
            uVar19 = (long)uVar20 >> 5;
            uVar13 = uVar19;
            if (pTStack_620 == local_628) {
              uVar13 = 1;
            }
            uVar22 = uVar13 + uVar19;
            if (0x3fffffffffffffe < uVar22) {
              uVar22 = 0x3ffffffffffffff;
            }
            if (CARRY8(uVar13,uVar19)) {
              uVar22 = 0x3ffffffffffffff;
            }
            if (uVar22 == 0) {
              pTVar14 = (TextureFormat *)0x0;
            }
            else {
              pTVar14 = (TextureFormat *)operator_new(uVar22 << 5);
            }
            pTVar16 = pTVar14 + uVar19 * 4 + 2;
            pTVar16->order = auStack_448._8_4_;
            pTVar16->type = auStack_448._12_4_;
            pTVar16[1].order = CStack_438;
            pTVar16[1].type = CStack_434;
            pTVar16 = pTVar14 + uVar19 * 4;
            pTVar16->order = local_450._0_4_;
            pTVar16->type = local_450._4_4_;
            pTVar16[1].order = auStack_448._0_4_;
            pTVar16[1].type = auStack_448._4_4_;
            if (0 < (long)uVar20) {
              memmove(pTVar14,pTVar6,uVar20);
            }
            if (pTVar6 != (TextureFormat *)0x0) {
              operator_delete(pTVar6,uVar20);
            }
            pTStack_620 = (TextureFormat *)((long)pTVar14 + uVar20);
            local_618 = pTVar14 + uVar22 * 4;
            local_628 = pTVar14;
          }
          else {
            pTStack_620[2].order = auStack_448._8_4_;
            pTStack_620[2].type = auStack_448._12_4_;
            pTStack_620[3].order = (ChannelOrder)uVar24;
            pTStack_620[3].type = CVar4;
            pTStack_620->order = local_450._0_4_;
            pTStack_620->type = local_450._4_4_;
            pTStack_620[1].order = auStack_448._0_4_;
            pTStack_620[1].type = auStack_448._4_4_;
          }
          pTStack_620 = pTStack_620 + 4;
          uVar24 = uVar24 + 1;
        } while (uVar24 < (ulong)((long)local_648.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_648.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start >> 2));
      }
      local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"Samples","");
      local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"Samples","");
      pTVar14 = pTStack_620;
      pTVar6 = local_628;
      uVar24 = (long)pTStack_620 - (long)local_628 >> 5;
      if (pTStack_620 == local_628) {
        bVar25 = false;
      }
      else {
        bVar25 = true;
        if ((local_628[1] == (TextureFormat)0x0) && (*local_628 == (TextureFormat)0x0)) {
          pTVar16 = local_628 + 5;
          uVar20 = 1;
          do {
            uVar13 = uVar20;
            if ((uVar24 + (uVar24 == 0) == uVar13) || (*pTVar16 != (TextureFormat)0x0)) break;
            pTVar1 = pTVar16 + -1;
            pTVar16 = pTVar16 + 4;
            uVar20 = uVar13 + 1;
          } while (*pTVar1 == (TextureFormat)0x0);
          bVar25 = uVar13 < uVar24;
        }
      }
      TVar5 = (TextureFormat)((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
      tcu::LogSampleList::LogSampleList((LogSampleList *)local_450,&local_2a0,&local_2c0);
      tcu::TestLog::startSampleList((TestLog *)TVar5,(string *)local_450,(string *)local_430);
      if ((pointer)local_430._0_8_ != (pointer)(local_430 + 0x10)) {
        operator_delete((void *)local_430._0_8_,(ulong)(local_430._16_8_ + 1));
      }
      if (local_450 != (undefined1  [8])((long)auStack_448 + 8)) {
        operator_delete((void *)local_450,auStack_448._8_8_ + 1);
      }
      tcu::TestLog::startSampleInfo((TestLog *)TVar5);
      if (bVar25) {
        local_548._M_dataplus._M_p = (pointer)&local_548.field_2;
        local_548.field_2._M_allocated_capacity = 0x64616f6c6b726f57;
        local_548._M_string_length = 8;
        local_548.field_2._M_local_buf[8] = '\0';
        local_568._M_dataplus._M_p = (pointer)&local_568.field_2;
        local_568.field_2._M_allocated_capacity = 0x64616f6c6b726f57;
        local_568._M_string_length = 8;
        local_568.field_2._M_local_buf[8] = '\0';
        local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
        local_4e8._M_string_length = 0;
        local_4e8.field_2._M_local_buf[0] = '\0';
        tcu::LogValueInfo::LogValueInfo
                  ((LogValueInfo *)local_450,&local_548,&local_568,&local_4e8,
                   QP_SAMPLE_VALUE_TAG_PREDICTOR);
        tcu::TestLog::writeValueInfo
                  ((TestLog *)TVar5,(string *)local_450,(string *)local_430,(string *)&local_410,
                   local_3f0);
        local_588._M_dataplus._M_p = (pointer)&local_588.field_2;
        local_588.field_2._M_allocated_capacity._0_4_ = 0x6564724f;
        local_588.field_2._M_allocated_capacity._4_2_ = 0x72;
        local_588._M_string_length = 5;
        local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
        local_508.field_2._M_allocated_capacity._0_7_ = 0x6f20726564724f;
        local_508.field_2._M_local_buf[7] = 'f';
        local_508.field_2._M_local_buf[8] = ' ';
        local_508.field_2._9_6_ = 0x656c706d6173;
        local_508._M_string_length = 0xf;
        local_508.field_2._M_local_buf[0xf] = '\0';
        local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
        local_5a8._M_string_length = 0;
        local_5a8.field_2._M_allocated_capacity =
             local_5a8.field_2._M_allocated_capacity & 0xffffffffffffff00;
        tcu::LogValueInfo::LogValueInfo
                  (&local_220,&local_588,&local_508,&local_5a8,QP_SAMPLE_VALUE_TAG_PREDICTOR);
        tcu::TestLog::writeValueInfo
                  ((TestLog *)TVar5,&local_220.m_name,&local_220.m_description,&local_220.m_unit,
                   local_220.m_tag);
        local_528._M_dataplus._M_p = (pointer)&local_528.field_2;
        local_528.field_2._M_allocated_capacity = 0x656d695474736554;
        local_528._M_string_length = 8;
        local_528.field_2._M_local_buf[8] = '\0';
        local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
        local_4c8.m_name._M_dataplus._M_p = &DAT_00000010;
        local_240._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_240,(ulong)&local_4c8);
        local_240.field_2._M_allocated_capacity = (size_type)local_4c8.m_name._M_dataplus._M_p;
        builtin_strncpy(local_240._M_dataplus._M_p,"Test render time",0x10);
        local_240._M_string_length = (size_type)local_4c8.m_name._M_dataplus._M_p;
        local_240._M_dataplus._M_p[(long)local_4c8.m_name._M_dataplus._M_p] = '\0';
        local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
        local_198.field_2._M_allocated_capacity._0_2_ = 0x7375;
        local_198._M_string_length = 2;
        local_198.field_2._M_local_buf[2] = '\0';
        tcu::LogValueInfo::LogValueInfo
                  (&local_610,&local_528,&local_240,&local_198,QP_SAMPLE_VALUE_TAG_RESPONSE);
        tcu::TestLog::writeValueInfo
                  ((TestLog *)TVar5,&local_610.m_name,&local_610.m_description,&local_610.m_unit,
                   local_610.m_tag);
        local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
        local_1b8.field_2._M_allocated_capacity = 0x656d69546c6c754e;
        local_1b8._M_string_length = 8;
        local_1b8.field_2._M_local_buf[8] = '\0';
        local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
        local_128.m_name._M_dataplus._M_p = &DAT_00000010;
        local_260._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_260,(ulong)&local_128);
        local_260.field_2._M_allocated_capacity = (size_type)local_128.m_name._M_dataplus._M_p;
        builtin_strncpy(local_260._M_dataplus._M_p,"Read pixels time",0x10);
        local_260._M_string_length = (size_type)local_128.m_name._M_dataplus._M_p;
        local_260._M_dataplus._M_p[(long)local_128.m_name._M_dataplus._M_p] = '\0';
        local_a0.field_2._M_allocated_capacity._0_2_ = 0x7375;
        local_a0._M_string_length = 2;
        local_a0.field_2._M_local_buf[2] = '\0';
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        tcu::LogValueInfo::LogValueInfo
                  (&local_4c8,&local_1b8,&local_260,&local_a0,QP_SAMPLE_VALUE_TAG_RESPONSE);
        tcu::TestLog::writeValueInfo
                  ((TestLog *)TVar5,&local_4c8.m_name,&local_4c8.m_description,&local_4c8.m_unit,
                   local_4c8.m_tag);
        local_c0.field_2._M_allocated_capacity = 0x656d695465736142;
        local_c0._M_string_length = 8;
        local_c0.field_2._M_local_buf[8] = '\0';
        local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
        local_178._M_dataplus._M_p = &DAT_00000010;
        local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
        local_280._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_280,(ulong)&local_178);
        local_280.field_2._M_allocated_capacity = (size_type)local_178._M_dataplus._M_p;
        builtin_strncpy(local_280._M_dataplus._M_p,"Base render time",0x10);
        local_280._M_string_length = (size_type)local_178._M_dataplus._M_p;
        local_280._M_dataplus._M_p[(long)local_178._M_dataplus._M_p] = '\0';
        local_178.field_2._M_allocated_capacity._0_2_ = 0x7375;
        local_178._M_string_length = 2;
        local_178.field_2._M_local_buf[2] = '\0';
        local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
        tcu::LogValueInfo::LogValueInfo
                  (&local_128,&local_c0,&local_280,&local_178,QP_SAMPLE_VALUE_TAG_RESPONSE);
        tcu::TestLog::writeValueInfo
                  ((TestLog *)TVar5,&local_128.m_name,&local_128.m_description,&local_128.m_unit,
                   local_128.m_tag);
        tcu::TestLog::endSampleInfo((TestLog *)TVar5);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128.m_unit._M_dataplus._M_p != &local_128.m_unit.field_2) {
          operator_delete(local_128.m_unit._M_dataplus._M_p,
                          local_128.m_unit.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128.m_description._M_dataplus._M_p != &local_128.m_description.field_2) {
          operator_delete(local_128.m_description._M_dataplus._M_p,
                          local_128.m_description.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128.m_name._M_dataplus._M_p != &local_128.m_name.field_2) {
          operator_delete(local_128.m_name._M_dataplus._M_p,
                          local_128.m_name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != &local_178.field_2) {
          operator_delete(local_178._M_dataplus._M_p,
                          CONCAT53(local_178.field_2._M_allocated_capacity._3_5_,
                                   CONCAT12(local_178.field_2._M_local_buf[2],
                                            local_178.field_2._M_allocated_capacity._0_2_)) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._M_dataplus._M_p != &local_280.field_2) {
          operator_delete(local_280._M_dataplus._M_p,
                          (ulong)(local_280.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4c8.m_unit._M_dataplus._M_p != &local_4c8.m_unit.field_2) {
          operator_delete(local_4c8.m_unit._M_dataplus._M_p,
                          local_4c8.m_unit.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4c8.m_description._M_dataplus._M_p != &local_4c8.m_description.field_2) {
          operator_delete(local_4c8.m_description._M_dataplus._M_p,
                          local_4c8.m_description.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4c8.m_name._M_dataplus._M_p != &local_4c8.m_name.field_2) {
          operator_delete(local_4c8.m_name._M_dataplus._M_p,
                          CONCAT35(local_4c8.m_name.field_2._M_allocated_capacity._5_3_,
                                   local_4c8.m_name.field_2._M_allocated_capacity._0_5_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,
                          CONCAT53(local_a0.field_2._M_allocated_capacity._3_5_,
                                   CONCAT12(local_a0.field_2._M_local_buf[2],
                                            local_a0.field_2._M_allocated_capacity._0_2_)) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_260._M_dataplus._M_p != &local_260.field_2) {
          operator_delete(local_260._M_dataplus._M_p,
                          (ulong)(local_260.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
          operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_610.m_unit._M_dataplus._M_p != &local_610.m_unit.field_2) {
          operator_delete(local_610.m_unit._M_dataplus._M_p,
                          local_610.m_unit.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_610.m_description._M_dataplus._M_p != &local_610.m_description.field_2) {
          operator_delete(local_610.m_description._M_dataplus._M_p,
                          local_610.m_description.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_610.m_name._M_dataplus._M_p != &local_610.m_name.field_2) {
          operator_delete(local_610.m_name._M_dataplus._M_p,
                          CONCAT35(local_610.m_name.field_2._M_allocated_capacity._5_3_,
                                   local_610.m_name.field_2._M_allocated_capacity._0_5_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != &local_198.field_2) {
          operator_delete(local_198._M_dataplus._M_p,
                          CONCAT53(local_198.field_2._M_allocated_capacity._3_5_,
                                   CONCAT12(local_198.field_2._M_local_buf[2],
                                            local_198.field_2._M_allocated_capacity._0_2_)) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_240._M_dataplus._M_p != &local_240.field_2) {
          operator_delete(local_240._M_dataplus._M_p,
                          (ulong)(local_240.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_528._M_dataplus._M_p != &local_528.field_2) {
          operator_delete(local_528._M_dataplus._M_p,local_528.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220.m_unit._M_dataplus._M_p != &local_220.m_unit.field_2) {
          operator_delete(local_220.m_unit._M_dataplus._M_p,
                          local_220.m_unit.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220.m_description._M_dataplus._M_p != &local_220.m_description.field_2) {
          operator_delete(local_220.m_description._M_dataplus._M_p,
                          local_220.m_description.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220.m_name._M_dataplus._M_p != &local_220.m_name.field_2) {
          operator_delete(local_220.m_name._M_dataplus._M_p,
                          local_220.m_name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
          operator_delete(local_5a8._M_dataplus._M_p,
                          (ulong)(local_5a8.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_508._M_dataplus._M_p != &local_508.field_2) {
          operator_delete(local_508._M_dataplus._M_p,
                          CONCAT17(local_508.field_2._M_local_buf[7],
                                   local_508.field_2._M_allocated_capacity._0_7_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_588._M_dataplus._M_p != &local_588.field_2) {
          operator_delete(local_588._M_dataplus._M_p,
                          CONCAT26(local_588.field_2._M_allocated_capacity._6_2_,
                                   CONCAT24(local_588.field_2._M_allocated_capacity._4_2_,
                                            local_588.field_2._M_allocated_capacity._0_4_)) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_410._M_allocated_capacity != &local_400) {
          operator_delete((void *)local_410._M_allocated_capacity,
                          (ulong)(local_400._M_allocated_capacity + 1));
        }
        if ((pointer)local_430._0_8_ != (pointer)(local_430 + 0x10)) {
          operator_delete((void *)local_430._0_8_,(ulong)(local_430._16_8_ + 1));
        }
        if (local_450 != (undefined1  [8])((long)auStack_448 + 8)) {
          operator_delete((void *)local_450,auStack_448._8_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
          operator_delete(local_4e8._M_dataplus._M_p,
                          CONCAT17(local_4e8.field_2._M_local_buf[7],
                                   CONCAT61(local_4e8.field_2._M_allocated_capacity._1_6_,
                                            local_4e8.field_2._M_local_buf[0])) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_568._M_dataplus._M_p != &local_568.field_2) {
          operator_delete(local_568._M_dataplus._M_p,local_568.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_548._M_dataplus._M_p != &local_548.field_2) {
          operator_delete(local_548._M_dataplus._M_p,local_548.field_2._M_allocated_capacity + 1);
        }
        if (pTVar14 != pTVar6) {
          pCVar18 = &pTVar6[3].type;
          uVar20 = 0;
          do {
            auStack_448._0_4_ = R;
            auStack_448._4_4_ = SNORM_INT8;
            auStack_448._8_4_ = R;
            auStack_448._12_4_ = SNORM_INT8;
            CStack_438 = R;
            CStack_434 = SNORM_INT8;
            local_450 = (undefined1  [8])TVar5;
            pSVar15 = tcu::SampleBuilder::operator<<((SampleBuilder *)local_450,*pCVar18);
            pSVar15 = tcu::SampleBuilder::operator<<
                                (pSVar15,((TextureFormat *)(pCVar18 + -1))->order);
            pSVar15 = tcu::SampleBuilder::operator<<(pSVar15,*(deInt64 *)(pCVar18 + -3));
            pSVar15 = tcu::SampleBuilder::operator<<(pSVar15,*(deInt64 *)(pCVar18 + -7));
            pSVar15 = tcu::SampleBuilder::operator<<(pSVar15,*(deInt64 *)(pCVar18 + -5));
            tcu::SampleBuilder::operator<<(pSVar15,(EndSampleToken *)&tcu::TestLog::EndSample);
            if ((TextureFormat)auStack_448._0_8_ != (TextureFormat)0x0) {
              operator_delete((void *)auStack_448._0_8_,_CStack_438 - auStack_448._0_8_);
            }
            uVar20 = uVar20 + 1;
            pCVar18 = pCVar18 + 8;
          } while (uVar20 < uVar24);
        }
      }
      else {
        local_4c8.m_name._M_dataplus._M_p = (pointer)&local_4c8.m_name.field_2;
        local_4c8.m_name.field_2._M_allocated_capacity._0_5_ = 0x6c6b726f57;
        local_4c8.m_name._M_string_length = 8;
        local_4c8.m_name.field_2._5_4_ = 0x64616f;
        local_128.m_name._M_dataplus._M_p = (pointer)&local_128.m_name.field_2;
        local_128.m_name.field_2._M_allocated_capacity = 0x64616f6c6b726f57;
        local_128.m_name._M_string_length = 8;
        local_128.m_name.field_2._M_local_buf[8] = '\0';
        local_548._M_dataplus._M_p = (pointer)&local_548.field_2;
        local_548._M_string_length = 0;
        local_548.field_2._M_allocated_capacity =
             local_548.field_2._M_allocated_capacity & 0xffffffffffffff00;
        tcu::LogValueInfo::LogValueInfo
                  ((LogValueInfo *)local_450,&local_4c8.m_name,&local_128.m_name,&local_548,
                   QP_SAMPLE_VALUE_TAG_PREDICTOR);
        tcu::TestLog::writeValueInfo
                  ((TestLog *)TVar5,(string *)local_450,(string *)local_430,(string *)&local_410,
                   local_3f0);
        local_568._M_dataplus._M_p = (pointer)&local_568.field_2;
        local_568.field_2._M_allocated_capacity._0_6_ = 0x726564724f;
        local_568._M_string_length = 5;
        local_4e8.field_2._M_local_buf[0] = 'O';
        local_4e8.field_2._M_allocated_capacity._1_6_ = 0x6f2072656472;
        local_4e8.field_2._M_local_buf[7] = 'f';
        local_4e8.field_2._8_7_ = 0x656c706d617320;
        local_4e8._M_string_length = 0xf;
        local_4e8.field_2._M_local_buf[0xf] = '\0';
        local_588._M_dataplus._M_p = (pointer)&local_588.field_2;
        local_588._M_string_length = 0;
        local_588.field_2._M_allocated_capacity._0_4_ =
             local_588.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
        local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
        tcu::LogValueInfo::LogValueInfo
                  (&local_220,&local_568,&local_4e8,&local_588,QP_SAMPLE_VALUE_TAG_PREDICTOR);
        tcu::TestLog::writeValueInfo
                  ((TestLog *)TVar5,&local_220.m_name,&local_220.m_description,&local_220.m_unit,
                   local_220.m_tag);
        local_508.field_2._M_allocated_capacity._0_7_ = 0x6d695474736554;
        local_508.field_2._M_local_buf[7] = 'e';
        local_508._M_string_length = 8;
        local_508.field_2._M_local_buf[8] = '\0';
        local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
        local_528._M_dataplus._M_p = &DAT_00000010;
        local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
        local_5a8._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_5a8,(ulong)&local_528);
        local_5a8.field_2._M_allocated_capacity = (size_type)local_528._M_dataplus._M_p;
        *(undefined8 *)local_5a8._M_dataplus._M_p = 0x6e65722074736554;
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_5a8._M_dataplus._M_p + 8) = 'd';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_5a8._M_dataplus._M_p + 9) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_5a8._M_dataplus._M_p + 10) = 'r';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_5a8._M_dataplus._M_p + 0xb) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_5a8._M_dataplus._M_p + 0xc) = 't';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_5a8._M_dataplus._M_p + 0xd) = 'i';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_5a8._M_dataplus._M_p + 0xe) = 'm';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_5a8._M_dataplus._M_p + 0xf) = 'e';
        local_5a8._M_string_length = (size_type)local_528._M_dataplus._M_p;
        local_5a8._M_dataplus._M_p[(long)local_528._M_dataplus._M_p] = '\0';
        local_528._M_string_length = 2;
        local_528.field_2._M_allocated_capacity._0_3_ = 0x7375;
        local_528._M_dataplus._M_p = (pointer)&local_528.field_2;
        tcu::LogValueInfo::LogValueInfo
                  (&local_610,&local_508,&local_5a8,&local_528,QP_SAMPLE_VALUE_TAG_RESPONSE);
        tcu::TestLog::writeValueInfo
                  ((TestLog *)TVar5,&local_610.m_name,&local_610.m_description,&local_610.m_unit,
                   local_610.m_tag);
        tcu::TestLog::endSampleInfo((TestLog *)TVar5);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_610.m_unit._M_dataplus._M_p != &local_610.m_unit.field_2) {
          operator_delete(local_610.m_unit._M_dataplus._M_p,
                          local_610.m_unit.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_610.m_description._M_dataplus._M_p != &local_610.m_description.field_2) {
          operator_delete(local_610.m_description._M_dataplus._M_p,
                          local_610.m_description.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_610.m_name._M_dataplus._M_p != &local_610.m_name.field_2) {
          operator_delete(local_610.m_name._M_dataplus._M_p,
                          CONCAT35(local_610.m_name.field_2._M_allocated_capacity._5_3_,
                                   local_610.m_name.field_2._M_allocated_capacity._0_5_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_528._M_dataplus._M_p != &local_528.field_2) {
          operator_delete(local_528._M_dataplus._M_p,local_528.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
          operator_delete(local_5a8._M_dataplus._M_p,
                          (ulong)(local_5a8.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_508._M_dataplus._M_p != &local_508.field_2) {
          operator_delete(local_508._M_dataplus._M_p,
                          CONCAT17(local_508.field_2._M_local_buf[7],
                                   local_508.field_2._M_allocated_capacity._0_7_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220.m_unit._M_dataplus._M_p != &local_220.m_unit.field_2) {
          operator_delete(local_220.m_unit._M_dataplus._M_p,
                          local_220.m_unit.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220.m_description._M_dataplus._M_p != &local_220.m_description.field_2) {
          operator_delete(local_220.m_description._M_dataplus._M_p,
                          local_220.m_description.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220.m_name._M_dataplus._M_p != &local_220.m_name.field_2) {
          operator_delete(local_220.m_name._M_dataplus._M_p,
                          local_220.m_name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_588._M_dataplus._M_p != &local_588.field_2) {
          operator_delete(local_588._M_dataplus._M_p,
                          CONCAT26(local_588.field_2._M_allocated_capacity._6_2_,
                                   CONCAT24(local_588.field_2._M_allocated_capacity._4_2_,
                                            local_588.field_2._M_allocated_capacity._0_4_)) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
          operator_delete(local_4e8._M_dataplus._M_p,
                          CONCAT17(local_4e8.field_2._M_local_buf[7],
                                   CONCAT61(local_4e8.field_2._M_allocated_capacity._1_6_,
                                            local_4e8.field_2._M_local_buf[0])) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_568._M_dataplus._M_p != &local_568.field_2) {
          operator_delete(local_568._M_dataplus._M_p,local_568.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_410._M_allocated_capacity != &local_400) {
          operator_delete((void *)local_410._M_allocated_capacity,
                          (ulong)(local_400._M_allocated_capacity + 1));
        }
        if ((pointer)local_430._0_8_ != (pointer)(local_430 + 0x10)) {
          operator_delete((void *)local_430._0_8_,(ulong)(local_430._16_8_ + 1));
        }
        if (local_450 != (undefined1  [8])((long)auStack_448 + 8)) {
          operator_delete((void *)local_450,auStack_448._8_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_548._M_dataplus._M_p != &local_548.field_2) {
          operator_delete(local_548._M_dataplus._M_p,local_548.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128.m_name._M_dataplus._M_p != &local_128.m_name.field_2) {
          operator_delete(local_128.m_name._M_dataplus._M_p,
                          local_128.m_name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4c8.m_name._M_dataplus._M_p != &local_4c8.m_name.field_2) {
          operator_delete(local_4c8.m_name._M_dataplus._M_p,
                          CONCAT35(local_4c8.m_name.field_2._M_allocated_capacity._5_3_,
                                   local_4c8.m_name.field_2._M_allocated_capacity._0_5_) + 1);
        }
        if (pTVar14 != pTVar6) {
          pCVar18 = &pTVar6[3].type;
          uVar20 = 0;
          do {
            auStack_448._0_4_ = R;
            auStack_448._4_4_ = SNORM_INT8;
            auStack_448._8_4_ = R;
            auStack_448._12_4_ = SNORM_INT8;
            CStack_438 = R;
            CStack_434 = SNORM_INT8;
            local_450 = (undefined1  [8])TVar5;
            pSVar15 = tcu::SampleBuilder::operator<<((SampleBuilder *)local_450,*pCVar18);
            pSVar15 = tcu::SampleBuilder::operator<<
                                (pSVar15,((TextureFormat *)(pCVar18 + -1))->order);
            pSVar15 = tcu::SampleBuilder::operator<<(pSVar15,*(deInt64 *)(pCVar18 + -3));
            tcu::SampleBuilder::operator<<(pSVar15,(EndSampleToken *)&tcu::TestLog::EndSample);
            if ((TextureFormat)auStack_448._0_8_ != (TextureFormat)0x0) {
              operator_delete((void *)auStack_448._0_8_,_CStack_438 - auStack_448._0_8_);
            }
            uVar20 = uVar20 + 1;
            pCVar18 = pCVar18 + 8;
          } while (uVar20 < uVar24);
        }
      }
      tcu::TestLog::endSampleList((TestLog *)TVar5);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
        operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
        operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
      }
      (*(this->super_TestCase).super_TestNode._vptr_TestNode[5])(this,&local_628);
      tcu::ResultCollector::setTestContextResult
                (&this->m_results,(this->super_TestCase).super_TestNode.m_testCtx);
      tcu::TextureLevel::~TextureLevel(&local_68);
      de::details::
      UniqueBase<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
      ::reset(&local_460);
      de::details::
      UniqueBase<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
      ::reset(&local_2d0);
      if (local_648.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (int *)0x0) {
        operator_delete(local_648.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_648.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_648.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_628 != (TextureFormat *)0x0) {
        operator_delete(local_628,(long)local_618 - (long)local_628);
      }
      glu::ObjectWrapper::~ObjectWrapper(&local_158);
      glu::ObjectWrapper::~ObjectWrapper(&local_140);
      glu::ObjectWrapper::~ObjectWrapper(&local_80);
      return STOP;
    }
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,"occludedData->m_program.isOk()",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/performance/es3pDepthTests.cpp"
               ,0x244);
  }
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

BaseCase::IterateResult BaseCase::iterate (void)
{
	typedef de::MovePtr<RenderData> RenderDataP;

	const glw::Functions&	gl					= m_renderCtx.getFunctions();
	TestLog&				log					= m_testCtx.getLog();

	const glu::Framebuffer	framebuffer			(gl);
	const glu::Renderbuffer	renderbuffer		(gl);
	const glu::Renderbuffer	depthbuffer			(gl);

	vector<Sample>			results;
	vector<int>				params;
	RenderDataP				occluderData;
	RenderDataP				occludedData;
	tcu::TextureLevel		resultTex			(tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), RENDER_SIZE, RENDER_SIZE);
	int						maxWorkload			= 0;
	de::Random				rng					(deInt32Hash(deStringHash(getName())) ^ m_testCtx.getCommandLine().getBaseSeed());

	logDescription();

	gl.bindRenderbuffer(GL_RENDERBUFFER, *renderbuffer);
	gl.renderbufferStorage(GL_RENDERBUFFER, GL_RGBA8, RENDER_SIZE, RENDER_SIZE);
	gl.bindRenderbuffer(GL_RENDERBUFFER, *depthbuffer);
	gl.renderbufferStorage(GL_RENDERBUFFER, GL_DEPTH24_STENCIL8, RENDER_SIZE, RENDER_SIZE);

	gl.bindFramebuffer(GL_FRAMEBUFFER, *framebuffer);
	gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, *renderbuffer);
	gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, *depthbuffer);
	gl.viewport(0, 0, RENDER_SIZE, RENDER_SIZE);
	gl.clearColor(0.125f, 0.25f, 0.5f, 1.0f);

	maxWorkload = calibrate();

	// Setup data
	occluderData = RenderDataP(new RenderData (genOccluderGeometry(), m_renderCtx, log));
	occludedData = RenderDataP(new RenderData (genOccludedGeometry(), m_renderCtx, log));

	TCU_CHECK(occluderData->m_program.isOk());
	TCU_CHECK(occludedData->m_program.isOk());

	// Force initialization of GPU resources
	gl.clear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT | GL_STENCIL_BUFFER_BIT);
	gl.enable(GL_DEPTH_TEST);

	render(*occluderData);
	render(*occludedData);
	glu::readPixels(m_renderCtx, 0, 0, resultTex.getAccess());

	logGeometry(resultTex.getAccess(), occluderData->m_program, occludedData->m_program);

	params.reserve(ITERATION_STEPS*ITERATION_SAMPLES);

	// Setup parameters
	for (int step = 0; step < ITERATION_STEPS; step++)
	{
		const int workload = maxWorkload*step/ITERATION_STEPS;

		for (int count = 0; count < ITERATION_SAMPLES; count++)
			params.push_back(workload);
	}

	rng.shuffle(params.begin(), params.end());

	// Render samples
	for (size_t ndx = 0; ndx < params.size(); ndx++)
	{
		const int	workload	= params[ndx];
		Sample		sample		= renderSample(*occluderData, *occludedData, workload);

		sample.workload = workload;
		sample.order = int(ndx);

		results.push_back(sample);
	}

	logSamples(results, "Samples", "Samples");
	logAnalysis(results);

	m_results.setTestContextResult(m_testCtx);

	return STOP;
}